

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O2

void __thiscall
test::iu_PeepTest_x_iutest_x_ScopedPeep_Test::Body(iu_PeepTest_x_iutest_x_ScopedPeep_Test *this)

{
  int *in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_1d0;
  Fixed local_1a0;
  
  *(undefined4 *)
   (prod_test::s_prod +
   iutest::detail::peep_tag<test::iu_peep_tag_m_z<test::prod_test::ProdClass>>::value) = 4;
  local_1d0.m_message._M_dataplus._M_p._0_4_ = prod_test::s_prod._8_4_;
  local_1a0.super_Message.m_stream.super_iu_stringstream._0_4_ = 4;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x313851,"prod_test::s_prod.GetZ()",(char *)&local_1a0,
             (int *)&local_1d0,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x146,iutest_ar.m_message._M_dataplus._M_p);
    local_1d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_1a0.super_Message.m_stream.super_iu_stringstream._0_4_ = 4;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x313851,
             "(prod_test::s_prod.*::iutest::detail::peep_tag< iu_peep_tag_m_z<prod_test::ProdClass> >::value)"
             ,(char *)&local_1a0,
             (int *)(prod_test::s_prod +
                    iutest::detail::peep_tag<test::iu_peep_tag_m_z<test::prod_test::ProdClass>>::
                    value),in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x148,iutest_ar.m_message._M_dataplus._M_p);
    local_1d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  *(undefined4 *)
   (prod_test::s_prod +
   iutest::detail::peep_tag<test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::value) = 4;
  local_1d0.m_message._M_dataplus._M_p._0_4_ = prod_test::s_prod._4_4_;
  local_1a0.super_Message.m_stream.super_iu_stringstream._0_4_ = 4;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x313851,"prod_test::s_prod.GetX()",(char *)&local_1a0,
             (int *)&local_1d0,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x14c,iutest_ar.m_message._M_dataplus._M_p);
    local_1d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  local_1a0.super_Message.m_stream.super_iu_stringstream._0_4_ = 4;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)0x313851,
             "(prod_test::s_prod.*::iutest::detail::peep_tag< iu_peep_tag_m_x<prod_test::ProdClass> >::value)"
             ,(char *)&local_1a0,
             (int *)(prod_test::s_prod +
                    iutest::detail::peep_tag<test::iu_peep_tag_m_x<test::prod_test::ProdClass>>::
                    value),in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x14e,iutest_ar.m_message._M_dataplus._M_p);
    local_1d0._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d0,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(PeepTest, ScopedPeep)
{
    // マクロ版
    {
        IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_z) = 4;
        IUTEST_EXPECT_EQ(4, prod_test::s_prod.GetZ());

        IUTEST_EXPECT_EQ(4, IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_z));
    }
    {
        IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_x) = 4;
        IUTEST_EXPECT_EQ(4, prod_test::s_prod.GetX());

        IUTEST_EXPECT_EQ(4, IUTEST_PEEP_GET(prod_test::s_prod, prod_test::ProdClass, m_x));
    }
}